

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
          (SourceLocationCommentPrinter *this,string *output)

{
  pointer pbVar1;
  int i;
  ulong uVar2;
  long lVar3;
  string local_50;
  
  if (this->have_source_loc_ == true) {
    lVar3 = 0;
    for (uVar2 = 0;
        pbVar1 = (this->source_loc_).leading_detached_comments.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar2 < (ulong)((long)(this->source_loc_).leading_detached_comments.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar2 = uVar2 + 1) {
      FormatComment(&local_50,this,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
      std::__cxx11::string::append((string *)output);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((char *)output);
      lVar3 = lVar3 + 0x20;
    }
    if ((this->source_loc_).leading_comments._M_string_length != 0) {
      FormatComment(&local_50,this,&(this->source_loc_).leading_comments);
      std::__cxx11::string::append((string *)output);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void AddPreComment(std::string* output) {
    if (have_source_loc_) {
      // Detached leading comments.
      for (int i = 0; i < source_loc_.leading_detached_comments.size(); ++i) {
        *output += FormatComment(source_loc_.leading_detached_comments[i]);
        *output += "\n";
      }
      // Attached leading comments.
      if (!source_loc_.leading_comments.empty()) {
        *output += FormatComment(source_loc_.leading_comments);
      }
    }
  }